

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O1

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::
ReadPackedVarint<google::protobuf::internal::WireFormat::_InternalParseAndMergeField(google::protobuf::Message*,char_const*,google::protobuf::internal::ParseContext*,unsigned_long,google::protobuf::Reflection_const*,google::protobuf::FieldDescriptor_const*)::__0>
          (EpsCopyInputStream *this,char *ptr,anon_class_32_4_91646d40 add)

{
  byte bVar1;
  undefined8 uVar2;
  int iVar3;
  LogMessage *pLVar4;
  char *pcVar5;
  char *pcVar6;
  uint uVar7;
  char *ptr_00;
  int iVar8;
  uint uVar9;
  pair<const_char_*,_int> pVar10;
  char buf [26];
  char *local_d8;
  undefined8 local_c8;
  undefined2 uStack_c0;
  undefined6 uStack_be;
  undefined2 uStack_b8;
  undefined8 uStack_b6;
  LogMessage local_a0;
  LogMessage local_68;
  
  bVar1 = *ptr;
  uVar7 = (uint)bVar1;
  if ((char)bVar1 < '\0') {
    pVar10 = ReadSizeFallback(ptr,(uint)bVar1);
    ptr_00 = pVar10.first;
    uVar7 = pVar10.second;
  }
  else {
    ptr_00 = ptr + 1;
  }
  if (ptr_00 == (char *)0x0) {
LAB_003c65cf:
    local_d8 = (char *)0x0;
  }
  else {
    iVar3 = *(int *)&this->buffer_end_ - (int)ptr_00;
    do {
      iVar8 = uVar7 - iVar3;
      if (iVar8 == 0 || (int)uVar7 < iVar3) {
        pcVar6 = ReadPackedVarintArray<google::protobuf::internal::WireFormat::_InternalParseAndMergeField(google::protobuf::Message*,char_const*,google::protobuf::internal::ParseContext*,unsigned_long,google::protobuf::Reflection_const*,google::protobuf::FieldDescriptor_const*)::__0>
                           (ptr_00,ptr_00 + (int)uVar7,add);
        if (ptr_00 + (int)uVar7 != pcVar6) {
          return (char *)0x0;
        }
        return pcVar6;
      }
      ptr_00 = ReadPackedVarintArray<google::protobuf::internal::WireFormat::_InternalParseAndMergeField(google::protobuf::Message*,char_const*,google::protobuf::internal::ParseContext*,unsigned_long,google::protobuf::Reflection_const*,google::protobuf::FieldDescriptor_const*)::__0>
                         (ptr_00,this->buffer_end_,add);
      if (ptr_00 == (char *)0x0) goto LAB_003c65cf;
      uVar9 = (int)ptr_00 - (int)this->buffer_end_;
      if (0x10 < uVar9) {
        LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/parse_context.h"
                   ,0x2f2);
        pLVar4 = LogMessage::operator<<
                           (&local_68,"CHECK failed: overrun >= 0 && overrun <= kSlopBytes: ");
        LogFinisher::operator=((LogFinisher *)&local_c8,pLVar4);
        LogMessage::~LogMessage(&local_68);
      }
      if (iVar8 < 0x11) {
        uStack_b8 = 0;
        uStack_b6 = 0;
        local_c8 = *(undefined8 *)this->buffer_end_;
        uVar2 = *(undefined8 *)(this->buffer_end_ + 8);
        uStack_c0 = (undefined2)uVar2;
        uStack_be = (undefined6)((ulong)uVar2 >> 0x10);
        pcVar5 = ReadPackedVarintArray<google::protobuf::internal::WireFormat::_InternalParseAndMergeField(google::protobuf::Message*,char_const*,google::protobuf::internal::ParseContext*,unsigned_long,google::protobuf::Reflection_const*,google::protobuf::FieldDescriptor_const*)::__0>
                           ((char *)((long)&local_c8 + (long)(int)uVar9),
                            (char *)((long)&local_c8 + (long)iVar8),add);
        pcVar6 = (char *)0x0;
        local_d8 = this->buffer_end_ + ((long)pcVar5 - (long)&local_c8);
        if (pcVar5 != (char *)((long)&local_c8 + (long)iVar8)) {
          local_d8 = pcVar6;
        }
      }
      else {
        uVar7 = uVar7 - (iVar3 + uVar9);
        if ((int)uVar7 < 1) {
          LogMessage::LogMessage
                    (&local_a0,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/parse_context.h"
                     ,0x300);
          pLVar4 = LogMessage::operator<<(&local_a0,"CHECK failed: (size) > (0): ");
          LogFinisher::operator=((LogFinisher *)&local_c8,pLVar4);
          LogMessage::~LogMessage(&local_a0);
        }
        if ((this->limit_ < 0x11) || (ptr_00 = Next(this), ptr_00 == (char *)0x0)) {
          pcVar6 = (char *)0x0;
          local_d8 = (char *)0x0;
        }
        else {
          ptr_00 = ptr_00 + (int)uVar9;
          iVar3 = *(int *)&this->buffer_end_ - (int)ptr_00;
          pcVar6 = (char *)0x1;
        }
      }
    } while ((char)pcVar6 != '\0');
  }
  return local_d8;
}

Assistant:

const char* EpsCopyInputStream::ReadPackedVarint(const char* ptr, Add add) {
  int size = ReadSize(&ptr);
  GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
  int chunk_size = buffer_end_ - ptr;
  while (size > chunk_size) {
    ptr = ReadPackedVarintArray(ptr, buffer_end_, add);
    if (ptr == nullptr) return nullptr;
    int overrun = ptr - buffer_end_;
    GOOGLE_DCHECK(overrun >= 0 && overrun <= kSlopBytes);
    if (size - chunk_size <= kSlopBytes) {
      // The current buffer contains all the information needed, we don't need
      // to flip buffers. However we must parse from a buffer with enough space
      // so we are not prone to a buffer overflow.
      char buf[kSlopBytes + 10] = {};
      std::memcpy(buf, buffer_end_, kSlopBytes);
      GOOGLE_CHECK_LE(size - chunk_size, kSlopBytes);
      auto end = buf + (size - chunk_size);
      auto res = ReadPackedVarintArray(buf + overrun, end, add);
      if (res == nullptr || res != end) return nullptr;
      return buffer_end_ + (res - buf);
    }
    size -= overrun + chunk_size;
    GOOGLE_DCHECK_GT(size, 0);
    // We must flip buffers
    if (limit_ <= kSlopBytes) return nullptr;
    ptr = Next();
    if (ptr == nullptr) return nullptr;
    ptr += overrun;
    chunk_size = buffer_end_ - ptr;
  }
  auto end = ptr + size;
  ptr = ReadPackedVarintArray(ptr, end, add);
  return end == ptr ? ptr : nullptr;
}